

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

optional<pbrt::CameraRay> * __thiscall
pbrt::RealisticCamera::GenerateRay
          (optional<pbrt::CameraRay> *__return_storage_ptr__,RealisticCamera *this,
          CameraSample sample,SampledWavelengths *lambda)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  bool bVar5;
  Float FVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Point3f PVar14;
  Vector3<float> VVar15;
  float local_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  Tuple2<pbrt::Point2,_float> local_c0;
  anon_struct_8_0_00000001_for___align local_b8;
  float fStack_b0;
  Vector3<float> VStack_ac;
  Float FStack_a0;
  MediumHandle local_98;
  Ray local_88;
  SampledSpectrum local_60;
  Ray local_50;
  undefined1 extraout_var [56];
  undefined1 auVar11 [56];
  
  auVar12._8_8_ = 0;
  auVar12._0_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
  auVar12._4_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)((this->super_CameraBase).film.
                            super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                           0xffffffffffff);
  auVar3 = vcvtdq2ps_avx(auVar7);
  auVar3 = vdivps_avx(auVar12,auVar3);
  local_c0 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar3);
  auVar8._0_8_ = Bounds2<float>::Lerp(&this->physicalExtent,(Point2f *)&local_c0);
  auVar8._8_56_ = extraout_var;
  auVar3._8_4_ = 0x80000000;
  auVar3._0_8_ = 0x8000000080000000;
  auVar3._12_4_ = 0x80000000;
  local_e8 = auVar8._0_16_;
  local_f8 = vxorps_avx512vl(local_e8,auVar3);
  local_d8 = vmovshdup_avx(local_e8);
  local_88.o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_d8._0_4_;
  local_88.o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_f8._0_4_;
  auVar11 = extraout_var;
  PVar14 = SampleExitPupil(this,(Point2f *)&local_88,&sample.pLens,&local_fc);
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.z = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar11;
  VStack_ac.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  VStack_ac.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  auVar13._0_4_ = PVar14.super_Tuple3<pbrt::Point3,_float>.x + local_e8._0_4_;
  auVar13._4_4_ = PVar14.super_Tuple3<pbrt::Point3,_float>.y + local_e8._4_4_;
  auVar13._8_4_ = auVar11._0_4_ + local_e8._8_4_;
  auVar13._12_4_ = auVar11._4_4_ + local_e8._12_4_;
  auVar3 = vsubps_avx(auVar9._0_16_,local_e8);
  auVar3 = vblendps_avx(auVar13,auVar3,2);
  local_50.o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_f8._0_4_;
  local_50.o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_d8._0_4_;
  local_50.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_50.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar3);
  local_50.time = 0.0;
  local_50.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_b8 = (anon_struct_8_0_00000001_for___align)0x0;
  fStack_b0 = 0.0;
  VStack_ac.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  FVar6 = TraceLensesFromFilm(this,&local_50,(Ray *)&local_b8);
  if ((FVar6 != 0.0) || (NAN(FVar6))) {
    local_f8._0_4_ = FVar6;
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(sample.time * (this->super_CameraBase).shutterClose)),
                             ZEXT416((uint)(1.0 - sample.time)),
                             ZEXT416((uint)(this->super_CameraBase).shutterOpen));
    FStack_a0 = auVar3._0_4_;
    local_98.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             )(this->super_CameraBase).medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
              .bits;
    CameraTransform::RenderFromCamera(&local_88,(CameraTransform *)this,(Ray *)&local_b8);
    auVar11 = ZEXT856(CONCAT44(local_88.d.super_Tuple3<pbrt::Vector3,_float>.x,
                               local_88.o.super_Tuple3<pbrt::Point3,_float>.z));
    VStack_ac.super_Tuple3<pbrt::Vector3,_float>.z = local_88.d.super_Tuple3<pbrt::Vector3,_float>.z
    ;
    FStack_a0 = local_88.time;
    local_b8 = (anon_struct_8_0_00000001_for___align)
               local_88.o.super_Tuple3<pbrt::Point3,_float>._0_8_;
    fStack_b0 = local_88.o.super_Tuple3<pbrt::Point3,_float>.z;
    local_98.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = local_88.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
    VVar15 = Normalize<float>(&VStack_ac);
    VStack_ac.super_Tuple3<pbrt::Vector3,_float>.z = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar10._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar10._8_56_ = auVar11;
    uVar2 = vmovlps_avx(auVar10._0_16_);
    VStack_ac.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
    VStack_ac.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
    VVar15 = Normalize<float>(&local_50.d);
    fVar4 = VVar15.super_Tuple3<pbrt::Vector3,_float>.z *
            VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
    local_88.time = FStack_a0;
    local_88.d.super_Tuple3<pbrt::Vector3,_float>.z = VStack_ac.super_Tuple3<pbrt::Vector3,_float>.z
    ;
    fVar1 = (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].thickness;
    local_88.d.super_Tuple3<pbrt::Vector3,_float>.y = VStack_ac.super_Tuple3<pbrt::Vector3,_float>.y
    ;
    local_88.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = local_b8;
    local_88.o.super_Tuple3<pbrt::Point3,_float>.z = fStack_b0;
    local_88.d.super_Tuple3<pbrt::Vector3,_float>.x = VStack_ac.super_Tuple3<pbrt::Vector3,_float>.x
    ;
    local_88.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = local_98.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
    SampledSpectrum::SampledSpectrum
              (&local_60,
               ((((this->super_CameraBase).shutterClose - (this->super_CameraBase).shutterOpen) *
                 fVar4 * fVar4 * local_fc) / (fVar1 * fVar1)) * (float)local_f8._0_4_);
    *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xc) =
         CONCAT44(local_88.d.super_Tuple3<pbrt::Vector3,_float>.y,
                  local_88.d.super_Tuple3<pbrt::Vector3,_float>.x);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x14) = local_88._20_8_;
    (__return_storage_ptr__->optionalValue).__align =
         (anon_struct_8_0_00000001_for___align)local_88.o.super_Tuple3<pbrt::Point3,_float>._0_8_;
    *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
         CONCAT44(local_88.d.super_Tuple3<pbrt::Vector3,_float>.x,
                  local_88.o.super_Tuple3<pbrt::Point3,_float>.z);
    ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      *)((long)&__return_storage_ptr__->optionalValue + 0x20))->bits =
         (uintptr_t)
         local_88.medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         .bits;
    bVar5 = true;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
         local_60.values.values._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
         local_60.values.values._8_8_;
  }
  else {
    bVar5 = false;
    *__return_storage_ptr__ = (optional<pbrt::CameraRay>)ZEXT1264(ZEXT812(0));
  }
  __return_storage_ptr__->set = bVar5;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRay> RealisticCamera::GenerateRay(CameraSample sample,
                                                       SampledWavelengths &lambda) const {
    // Find point on film, _pFilm_, corresponding to _sample.pFilm_
    Point2f s(sample.pFilm.x / film.FullResolution().x,
              sample.pFilm.y / film.FullResolution().y);
    Point2f pFilm2 = physicalExtent.Lerp(s);
    Point3f pFilm(-pFilm2.x, pFilm2.y, 0);

    // Trace ray from _pFilm_ through lens system
    Float exitPupilBoundsArea;
    Point3f pRear =
        SampleExitPupil(Point2f(pFilm.x, pFilm.y), sample.pLens, &exitPupilBoundsArea);
    Ray rFilm(pFilm, pRear - pFilm);
    Ray ray;
    Float weight = TraceLensesFromFilm(rFilm, &ray);
    if (weight == 0)
        return {};

    // Finish initialization of _RealisticCamera_ ray
    ray.time = SampleTime(sample.time);
    ray.medium = medium;
    ray = RenderFromCamera(ray);
    ray.d = Normalize(ray.d);

    // Compute weighting for _RealisticCamera_ ray
    Float cosTheta = Normalize(rFilm.d).z;
    weight *= (shutterClose - shutterOpen) * Pow<4>(cosTheta) * exitPupilBoundsArea /
              Sqr(LensRearZ());

    return CameraRay{ray, SampledSpectrum(weight)};
}